

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

uint FSE_minTableLog(size_t srcSize,uint maxSymbolValue)

{
  uint uVar1;
  uint local_24;
  U32 minBits;
  U32 minBitsSymbols;
  U32 minBitsSrc;
  uint maxSymbolValue_local;
  size_t srcSize_local;
  
  uVar1 = ZSTD_highbit32((U32)srcSize);
  local_24 = ZSTD_highbit32(maxSymbolValue);
  local_24 = local_24 + 2;
  if (uVar1 + 1 < local_24) {
    local_24 = uVar1 + 1;
  }
  if (srcSize < 2) {
    __assert_fail("srcSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                  ,0x160,"unsigned int FSE_minTableLog(size_t, unsigned int)");
  }
  return local_24;
}

Assistant:

static unsigned FSE_minTableLog(size_t srcSize, unsigned maxSymbolValue)
{
    U32 minBitsSrc = ZSTD_highbit32((U32)(srcSize)) + 1;
    U32 minBitsSymbols = ZSTD_highbit32(maxSymbolValue) + 2;
    U32 minBits = minBitsSrc < minBitsSymbols ? minBitsSrc : minBitsSymbols;
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    return minBits;
}